

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall GlobOpt::IsSafeToTransferInPrePass(GlobOpt *this,Opnd *src,Value *srcValue)

{
  StackSym *pSVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  undefined4 *puVar5;
  StackSym *pSVar6;
  int32 local_2c [2];
  int32 srcIntConstantValue;
  
  OVar3 = IR::Opnd::GetKind(src);
  if (OVar3 == OpndKindReg) {
    OVar3 = IR::Opnd::GetKind(src);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    pSVar1 = (StackSym *)src[1]._vptr_Opnd;
    if ((pSVar1->field_0x1a & 4) != 0) {
      return true;
    }
    bVar4 = ValueInfo::TryGetIntConstantValue(srcValue->valueInfo,local_2c,false);
    if ((bVar4) && (pSVar6 = GetTaggedIntConstantStackSym(this,local_2c[0]), pSVar6 == pSVar1)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::IsSafeToTransferInPrePass(IR::Opnd *src, Value *srcValue)
{
    if (src->IsRegOpnd())
    {
        StackSym *srcSym = src->AsRegOpnd()->m_sym;
        if (srcSym->IsFromByteCodeConstantTable())
        {
            return true;
        }

        ValueInfo *srcValueInfo = srcValue->GetValueInfo();

        int32 srcIntConstantValue;
        if (srcValueInfo->TryGetIntConstantValue(&srcIntConstantValue) && !Js::TaggedInt::IsOverflow(srcIntConstantValue)
            && GetTaggedIntConstantStackSym(srcIntConstantValue) == srcSym)
        {
            return true;
        }
    }

    return false;
}